

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

bool __thiscall Process::Arguments::nextChar(Arguments *this)

{
  char **ppcVar1;
  Arguments *this_local;
  
  if (*this->arg == '\0') {
    if (this->argv < this->argvEnd) {
      ppcVar1 = this->argv;
      this->argv = ppcVar1 + 1;
      this->arg = *ppcVar1;
      this->inOpt = false;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this->arg = this->arg + 1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Process::Arguments::nextChar()
{
  if(*arg)
  {
    ++arg;
    return true;
  }
  if(argv < argvEnd)
  {
    arg = *(argv++);
    inOpt = false;
    return true;
  }
  return false;
}